

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void Client::handle_in(Client *self)

{
  Server *this;
  bool bVar1;
  ParseStatus PVar2;
  reference pp_Var3;
  HTTPResponse *this_00;
  size_t __n;
  void *__buf;
  int in_R8D;
  HTTPResponse *response;
  _func_HTTPResponse_ptr_Client_ptr *func;
  iterator __end2;
  iterator __begin2;
  vector<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_> *__range2;
  Client *self_local;
  
  __n = self->server->time_stamp;
  self->time_stamp = __n;
  ReadBuffer::do_read(&(self->request).buffer);
  do {
    PVar2 = HTTPRequest::parse(&self->request);
    if (PVar2 != PARSE_NEW_REQUEST) {
      return;
    }
    this = self->server;
    __end2 = std::vector<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_>
             ::begin(&this->http_request_hook);
    func = (_func_HTTPResponse_ptr_Client_ptr *)
           std::vector<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_>::
           end(&this->http_request_hook);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<HTTPResponse_*(**)(Client_*),_std::vector<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_>_>
                                       *)&func), bVar1) {
      pp_Var3 = __gnu_cxx::
                __normal_iterator<HTTPResponse_*(**)(Client_*),_std::vector<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_>_>
                ::operator*(&__end2);
      this_00 = (**pp_Var3)(self);
      if (this_00 != (HTTPResponse *)0x0) {
        HTTPResponse::parse(this_00);
        HTTPResponse::send(this_00,self->fd,__buf,__n,in_R8D);
        if (this_00 != (HTTPResponse *)0x0) {
          HTTPResponse::~HTTPResponse(this_00);
          operator_delete(this_00);
        }
        break;
      }
      __gnu_cxx::
      __normal_iterator<HTTPResponse_*(**)(Client_*),_std::vector<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_>_>
      ::operator++(&__end2);
    }
    HTTPRequest::clean(&self->request);
  } while( true );
}

Assistant:

void Client::handle_in(Client *self) {
    self->time_stamp = self->server->time_stamp;
    self->request.buffer.do_read();
    while (self->request.parse() == PARSE_NEW_REQUEST) {
        for (auto func : self->server->http_request_hook) {
            auto response = func(self);
            if (response != nullptr) {
                response->parse();
                response->send(self->fd);
                delete response;
                break;
            }
        }
        self->request.clean();
    }
}